

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ymf271.c
# Opt level: O0

INT64 calculate_op(YMF271Chip *chip,int slotnum,INT64 inp)

{
  short sVar1;
  int iVar2;
  YMF271Slot *slot_00;
  long local_40;
  INT64 slot_input;
  INT64 slot_output;
  INT64 env;
  YMF271Slot *slot;
  INT64 inp_local;
  int slotnum_local;
  YMF271Chip *chip_local;
  
  slot_00 = chip->slots + slotnum;
  local_40 = 0;
  update_envelope(slot_00);
  update_lfo(chip,slot_00);
  iVar2 = calculate_slot_volume(chip,slot_00);
  if (inp == -1) {
    local_40 = (slot_00->feedback_modulation0 + slot_00->feedback_modulation1) / 2;
    slot_00->feedback_modulation0 = slot_00->feedback_modulation1;
  }
  else if (inp != -2) {
    local_40 = inp * 0x100 * (long)modulation_level[slot_00->feedback];
  }
  sVar1 = chip->lut_waves[slot_00->waveform][slot_00->stepptr + local_40 >> 0x10 & 0x3ff];
  slot_00->stepptr = (ulong)slot_00->step + slot_00->stepptr;
  return (long)sVar1 * (long)iVar2 >> 0x10;
}

Assistant:

static INT64 calculate_op(YMF271Chip *chip, int slotnum, INT64 inp)
{
	YMF271Slot *slot = &chip->slots[slotnum];
	INT64 env, slot_output, slot_input = 0;

	update_envelope(slot);
	update_lfo(chip, slot);
	env = calculate_slot_volume(chip, slot);

	if (inp == OP_INPUT_FEEDBACK)
	{
		// from own feedback
		slot_input = (slot->feedback_modulation0 + slot->feedback_modulation1) / 2;
		slot->feedback_modulation0 = slot->feedback_modulation1;
	}
	else if (inp != OP_INPUT_NONE)
	{
		// from previous slot output
		slot_input = ((inp << (SIN_BITS-2)) * modulation_level[slot->feedback]);
	}

	slot_output = chip->lut_waves[slot->waveform][((slot->stepptr + slot_input) >> 16) & SIN_MASK];
	slot_output = (slot_output * env) >> 16;
	slot->stepptr += slot->step;

	return slot_output;
}